

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

void drwav__pcm_to_f32(float *pOut,uchar *pIn,size_t sampleCount,unsigned_short bytesPerSample)

{
  short sVar1;
  uint local_38;
  uint j;
  uint shift;
  drwav_uint64 sample;
  uint i;
  unsigned_short bytesPerSample_local;
  size_t sampleCount_local;
  uchar *pIn_local;
  float *pOut_local;
  
  if (bytesPerSample == 1) {
    drwav_u8_to_f32(pOut,pIn,sampleCount);
  }
  else if (bytesPerSample == 2) {
    drwav_s16_to_f32(pOut,(drwav_int16 *)pIn,sampleCount);
  }
  else if (bytesPerSample == 3) {
    drwav_s24_to_f32(pOut,pIn,sampleCount);
  }
  else if (bytesPerSample == 4) {
    drwav_s32_to_f32(pOut,(drwav_int32 *)pIn,sampleCount);
  }
  else if (bytesPerSample < 9) {
    sampleCount_local = (size_t)pIn;
    pIn_local = (uchar *)pOut;
    for (sample._0_4_ = 0; (uint)sample < sampleCount; sample._0_4_ = (uint)sample + 1) {
      _j = 0;
      sVar1 = (8 - bytesPerSample) * 8;
      for (local_38 = 0; local_38 < bytesPerSample && local_38 < 8; local_38 = local_38 + 1) {
        _j = (ulong)*(byte *)(sampleCount_local + local_38) << ((byte)sVar1 & 0x3f) | _j;
        sVar1 = sVar1 + 8;
      }
      sampleCount_local = sampleCount_local + local_38;
      *(float *)pIn_local = (float)((double)(long)_j / 9.223372036854776e+18);
      pIn_local = pIn_local + 4;
    }
  }
  else {
    memset(pOut,0,sampleCount << 2);
  }
  return;
}

Assistant:

static void drwav__pcm_to_f32(float* pOut, const unsigned char* pIn, size_t sampleCount,
                              unsigned short bytesPerSample) {
    // Special case for 8-bit sample data because it's treated as unsigned.
    if (bytesPerSample == 1) {
        drwav_u8_to_f32(pOut, pIn, sampleCount);
        return;
    }

    // Slightly more optimal implementation for common formats.
    if (bytesPerSample == 2) {
        drwav_s16_to_f32(pOut, (const drwav_int16*)pIn, sampleCount);
        return;
    }
    if (bytesPerSample == 3) {
        drwav_s24_to_f32(pOut, pIn, sampleCount);
        return;
    }
    if (bytesPerSample == 4) {
        drwav_s32_to_f32(pOut, (const drwav_int32*)pIn, sampleCount);
        return;
    }


    // Anything more than 64 bits per sample is not supported.
    if (bytesPerSample > 8) {
        drwav_zero_memory(pOut, sampleCount * sizeof(*pOut));
        return;
    }


    // Generic, slow converter.
    for (unsigned int i = 0; i < sampleCount; ++i) {
        drwav_uint64 sample = 0;
        unsigned int shift = (8 - bytesPerSample) * 8;

        unsigned int j;
        for (j = 0; j < bytesPerSample && j < 8; j += 1) {
            sample |= (drwav_uint64)(pIn[j]) << shift;
            shift += 8;
        }

        pIn += j;
        *pOut++ = (float)((drwav_int64)sample / 9223372036854775807.0);
    }
}